

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

int __thiscall GameBoard::transfer(GameBoard *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  
  uVar11 = this->transCount[0];
  iVar1 = this->transCount[1];
  if (uVar11 != 0 || iVar1 != 0) {
    if (uVar11 == 0) {
      uVar9 = (ulong)(0 < iVar1);
      uVar6 = (ulong)(iVar1 < 1);
      uVar11 = this->transCount[uVar9];
    }
    else {
      if (iVar1 != 0) {
        iVar2 = this->maxHeight[0];
        iVar10 = iVar2 + iVar1;
        this->maxHeight[0] = iVar10;
        iVar13 = this->maxHeight[1] + uVar11;
        this->maxHeight[1] = iVar13;
        if (0x14 < iVar10) {
          return 0;
        }
        if (iVar13 < 0x15) {
          if ((int)uVar11 < iVar13) {
            lVar5 = (long)iVar13;
            piVar8 = this->gridInfo[1][lVar5] + 1;
            do {
              lVar12 = 0;
              do {
                piVar8[lVar12] = (piVar8 + lVar12)[(long)this->transCount[0] * -0xc];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 10);
              lVar5 = lVar5 + -1;
              uVar11 = this->transCount[0];
              piVar8 = piVar8 + -0xc;
            } while ((int)uVar11 < lVar5);
          }
          if (0 < (int)uVar11) {
            piVar8 = this->trans[-1][(ulong)uVar11 + 3] + 1;
            uVar6 = (ulong)uVar11;
            do {
              lVar5 = 0;
              do {
                piVar8[lVar5 + -0xfc] = piVar8[lVar5];
                lVar5 = lVar5 + 1;
              } while (lVar5 != 10);
              piVar8 = piVar8 + -0xc;
              bVar4 = 1 < (long)uVar6;
              uVar6 = uVar6 - 1;
            } while (bVar4);
          }
          uVar11 = this->transCount[1];
          if ((int)uVar11 < iVar10) {
            lVar5 = (long)iVar1 + (long)iVar2;
            piVar8 = this->gridInfo[0][(long)iVar2 + (long)iVar1] + 1;
            do {
              lVar12 = 0;
              do {
                piVar8[lVar12] = (piVar8 + lVar12)[(long)this->transCount[1] * -0xc];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 10);
              lVar5 = lVar5 + -1;
              uVar11 = this->transCount[1];
              piVar8 = piVar8 + -0xc;
            } while ((int)uVar11 < lVar5);
          }
          if ((int)uVar11 < 1) {
            return -1;
          }
          piVar8 = this->trans[0][(ulong)uVar11 + 3] + 1;
          uVar6 = (ulong)uVar11;
          do {
            lVar5 = 0;
            do {
              piVar8[lVar5 + -0x234] = piVar8[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 10);
            piVar8 = piVar8 + -0xc;
            bVar4 = 1 < (long)uVar6;
            uVar6 = uVar6 - 1;
          } while (bVar4);
          return -1;
        }
        return 1;
      }
      uVar6 = 1;
      uVar9 = 0;
    }
    uVar3 = this->maxHeight[uVar6];
    this->maxHeight[uVar6] = uVar3 + uVar11;
    if (0x14 < (int)(uVar3 + uVar11)) {
      return (int)uVar6;
    }
    if (0 < (int)uVar3) {
      lVar5 = (ulong)uVar3 + (long)(int)uVar11;
      piVar8 = this->gridInfo[uVar6][(long)(int)uVar11 + (ulong)uVar3] + 1;
      do {
        lVar12 = 0;
        do {
          piVar8[lVar12] = (piVar8 + lVar12)[(long)this->transCount[uVar9] * -0xc];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 10);
        lVar5 = lVar5 + -1;
        uVar11 = this->transCount[uVar9];
        piVar8 = piVar8 + -0xc;
      } while ((int)uVar11 < lVar5);
    }
    if (0 < (int)uVar11) {
      uVar7 = (ulong)uVar11;
      lVar5 = (long)this->trans[-1][uVar7 + 3] + (ulong)(uint)((int)uVar9 * 0xc0) + 4;
      piVar8 = this->gridInfo[uVar6][uVar7] + 1;
      do {
        lVar12 = 0;
        do {
          piVar8[lVar12] = *(int *)(lVar5 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 10);
        lVar5 = lVar5 + -0x30;
        piVar8 = piVar8 + -0xc;
        bVar4 = 1 < (long)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar4);
    }
  }
  return -1;
}

Assistant:

int GameBoard::transfer()
{
    int color1 = 0, color2 = 1;
    if (transCount[color1] == 0 && transCount[color2] == 0)
        return -1;
    if (transCount[color1] == 0 || transCount[color2] == 0) {
        if (transCount[color1] == 0 && transCount[color2] > 0)
            swap(color1, color2);
        int h2;
        maxHeight[color2] = h2 = maxHeight[color2] + transCount[color1];
        if (h2 > MAPHEIGHT)
            return color2;
        int i, j;

        for (i = h2; i > transCount[color1]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = gridInfo[color2][i - transCount[color1]][j];

        for (i = transCount[color1]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = trans[color1][i - 1][j];
        return -1;
    }
    else {
        int h1, h2;
        maxHeight[color1] = h1 = maxHeight[color1] + transCount[color2];//从color1处移动count1去color2
        maxHeight[color2] = h2 = maxHeight[color2] + transCount[color1];

        if (h1 > MAPHEIGHT)
            return color1;
        if (h2 > MAPHEIGHT)
            return color2;

        int i, j;
        for (i = h2; i > transCount[color1]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = gridInfo[color2][i - transCount[color1]][j];

        for (i = transCount[color1]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = trans[color1][i - 1][j];

        for (i = h1; i > transCount[color2]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color1][i][j] = gridInfo[color1][i - transCount[color2]][j];

        for (i = transCount[color2]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color1][i][j] = trans[color2][i - 1][j];

        return -1;
    }
}